

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.hh
# Opt level: O0

size_t __thiscall tinyusdz::tydra::VertexAttribute::vertex_count(VertexAttribute *this)

{
  size_type sVar1;
  size_t sVar2;
  size_t itemSize;
  VertexAttribute *this_local;
  
  if (this->stride == 0) {
    sVar2 = stride_bytes(this);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data);
    if (sVar1 % sVar2 == 0) {
      sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data);
      this_local = (VertexAttribute *)(sVar1 / sVar2);
    }
    else {
      this_local = (VertexAttribute *)0x0;
    }
  }
  else {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data);
    this_local = (VertexAttribute *)(sVar1 / this->stride);
  }
  return (size_t)this_local;
}

Assistant:

size_t vertex_count() const {
    if (stride != 0) {
      // TODO: return 0 when (data.size() % stride) != 0?
      return data.size() / stride;
    }

    size_t itemSize = stride_bytes();

    if ((data.size() % itemSize) != 0) {
      // data size mismatch
      return 0;
    }

    return data.size() / itemSize;
  }